

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

StringTree * capnp::compiler::binaryLiteral(StringTree *__return_storage_ptr__,Reader data)

{
  ArrayDisposer **this;
  size_t sVar1;
  char *in_R8;
  undefined1 local_6b [10];
  byte b;
  uchar *__end2;
  byte *local_50;
  uchar *__begin2;
  Reader *__range2;
  Vector<char> escaped;
  Reader data_local;
  
  escaped.builder.disposer = (ArrayDisposer *)data.super_ArrayPtr<const_unsigned_char>.ptr;
  this = &escaped.builder.disposer;
  sVar1 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)this);
  kj::Vector<char>::Vector((Vector<char> *)&__range2,sVar1 * 3);
  __begin2 = (uchar *)this;
  local_50 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)this);
  register0x00000000 =
       kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)__begin2);
  for (; local_50 != stack0xffffffffffffff98; local_50 = local_50 + 1) {
    local_6b[2] = *local_50;
    kj::Vector<char>::add<char_const&>
              ((Vector<char> *)&__range2,"0123456789abcdef" + (local_6b[2] & 0xf));
    kj::Vector<char>::add<char_const&>
              ((Vector<char> *)&__range2,"0123456789abcdef" + (local_6b[2] >> 4));
    local_6b[1] = 0x20;
    kj::Vector<char>::add<char>((Vector<char> *)&__range2,local_6b + 1);
  }
  kj::Vector<char>::removeLast((Vector<char> *)&__range2);
  local_6b[0] = 0x22;
  kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
            (__return_storage_ptr__,(kj *)"0x\"",(char (*) [4])&__range2,(Vector<char> *)local_6b,
             in_R8);
  kj::Vector<char>::~Vector((Vector<char> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree binaryLiteral(Data::Reader data) {
  kj::Vector<char> escaped(data.size() * 3);

  for (byte b: data) {
    escaped.add(HEXDIGITS[b % 16]);
    escaped.add(HEXDIGITS[b / 16]);
    escaped.add(' ');
  }

  escaped.removeLast();
  return kj::strTree("0x\"", escaped, '"');
}